

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int Bstrlib::getUnicodeCharCount(uchar *array)

{
  byte bVar1;
  uint local_24;
  uint local_20;
  int charCount;
  uint32 bitCountMask;
  uint8 c;
  uchar *array_local;
  
  bVar1 = *array;
  if ((bVar1 & 0x80) == 0) {
    array_local._4_4_ = (uint)(bVar1 != 0);
  }
  else {
    local_24 = 0;
    for (local_20 = 0x40; (bVar1 & local_20) != 0 && local_20 != 0; local_20 = local_20 >> 1) {
      local_24 = local_24 + 1;
    }
    array_local._4_4_ = local_24;
  }
  return array_local._4_4_;
}

Assistant:

int getUnicodeCharCount(const unsigned char * array)
    {
        const uint8 c = *array;
        if ((c & 0x80))
        {
            // The count bit mask
            uint32 bitCountMask = 0x40;
            // The consumption count
            int charCount = 0;

            while ((c & bitCountMask) != 0 && bitCountMask)
            {
                ++charCount;
                bitCountMask >>= 1;
            }
            return charCount;
        }
        return c == 0 ? 0 : 1;
    }